

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

bool __thiscall
wabt::anon_unknown_7::Validator::CheckHasTable(Validator *this,Location *loc,Opcode opcode)

{
  size_type sVar1;
  char *pcVar2;
  Location *loc_local;
  Validator *this_local;
  Opcode opcode_local;
  
  this_local._0_4_ = opcode.enum_;
  sVar1 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::size
                    (&this->current_module_->tables);
  if (sVar1 == 0) {
    pcVar2 = Opcode::GetName((Opcode *)&this_local);
    PrintError(this,loc,"%s requires an imported or defined table.",pcVar2);
  }
  return sVar1 != 0;
}

Assistant:

bool Validator::CheckHasTable(const Location* loc, Opcode opcode) {
  if (current_module_->tables.size() == 0) {
    PrintError(loc, "%s requires an imported or defined table.",
               opcode.GetName());
    return false;
  }

  return true;
}